

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

bool __thiscall Func::IsInPhase(Func *this,Phase tag)

{
  Phase *pPVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = (ulong)(this->topFunc->currentPhases).list.
                 super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.count;
  if ((long)uVar3 < 1) {
    bVar6 = false;
  }
  else {
    pPVar1 = (this->topFunc->currentPhases).list.
             super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.buffer;
    bVar6 = true;
    if (*pPVar1 != tag) {
      uVar4 = 0;
      do {
        uVar5 = uVar3;
        if (uVar3 - 1 == uVar4) break;
        uVar5 = uVar4 + 1;
        lVar2 = uVar4 + 1;
        uVar4 = uVar5;
      } while (pPVar1[lVar2] != tag);
      bVar6 = uVar5 < uVar3;
    }
  }
  return bVar6;
}

Assistant:

bool
Func::IsInPhase(Js::Phase tag)
{
    return this->GetTopFunc()->currentPhases.Contains(tag);
}